

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_im2col_gemm_int8.h
# Opt level: O0

void ncnn::convolution_im2col_pack_A_tile_int8(Mat *A,Mat *AT,int i,int max_ii,int k,int max_kk)

{
  undefined4 in_ECX;
  undefined4 in_EDX;
  Mat *in_RSI;
  int in_R8D;
  int in_R9D;
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  
  Gemm_x86_avx_utility::pack_A_tile_int8
            (in_RSI,(Mat *)CONCAT44(in_EDX,in_ECX),in_R8D,in_R9D,in_stack_ffffffffffffffdc,
             in_stack_ffffffffffffffd8);
  return;
}

Assistant:

static void convolution_im2col_pack_A_tile_int8(const Mat& A, Mat& AT, int i, int max_ii, int k, int max_kk)
{
    // A = (pa, maxk, inch/pa), outch

#if NCNN_RUNTIME_CPU && __AVX512F__
    Gemm_x86_avx512_utility::pack_A_tile_int8(A, AT, i, max_ii, k, max_kk);
#elif NCNN_RUNTIME_CPU && __FMA__
    Gemm_x86_fma_utility::pack_A_tile_int8(A, AT, i, max_ii, k, max_kk);
#elif NCNN_RUNTIME_CPU && __AVX__
    Gemm_x86_avx_utility::pack_A_tile_int8(A, AT, i, max_ii, k, max_kk);
#else
    Gemm_x86_utility::pack_A_tile_int8(A, AT, i, max_ii, k, max_kk);
#endif
}